

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

_Bool roaring_iterate64(roaring_bitmap_t *r,roaring_iterator64 iterator,uint64_t high_bits,void *ptr
                       )

{
  _Bool _Var1;
  array_container_t *cont;
  long lVar2;
  uint32_t base;
  long lVar3;
  uint8_t local_39;
  void *local_38;
  
  local_38 = ptr;
  for (lVar3 = 0; lVar2 = (long)(r->high_low_container).size, lVar3 < lVar2; lVar3 = lVar3 + 1) {
    local_39 = (r->high_low_container).typecodes[lVar3];
    base = (uint)(r->high_low_container).keys[lVar3] << 0x10;
    cont = (array_container_t *)
           container_unwrap_shared((r->high_low_container).containers[lVar3],&local_39);
    if (local_39 == '\x01') {
      _Var1 = bitset_container_iterate64
                        ((bitset_container_t *)cont,base,iterator,high_bits,local_38);
    }
    else if (local_39 == '\x03') {
      _Var1 = run_container_iterate64((run_container_t *)cont,base,iterator,high_bits,local_38);
    }
    else {
      if (local_39 != '\x02') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1803,
                      "_Bool container_iterate64(const container_t *, uint8_t, uint32_t, roaring_iterator64, uint64_t, void *)"
                     );
      }
      _Var1 = array_container_iterate64(cont,base,iterator,high_bits,local_38);
    }
    if (_Var1 == false) break;
  }
  return lVar2 <= lVar3;
}

Assistant:

bool roaring_iterate64(const roaring_bitmap_t *r, roaring_iterator64 iterator,
                       uint64_t high_bits, void *ptr) {
    const roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i)
        if (!container_iterate64(
                ra->containers[i], ra->typecodes[i],
                ((uint32_t)ra->keys[i]) << 16, iterator,
                high_bits, ptr)) {
            return false;
        }
    return true;
}